

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlRegisterInputCallback(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  PyObject *cb;
  PyObject *local_10;
  
  pPVar2 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:libxml_xmlRegisterInputCallback",&local_10);
  if (iVar1 != 0) {
    iVar1 = PyCallable_Check(local_10);
    if (iVar1 == 0) {
      PyErr_SetString(_PyExc_ValueError,"input callback is not callable");
      pPVar2 = (PyObject *)0x0;
    }
    else {
      if (pythonInputCallbackID == -1) {
        pythonInputCallbackID =
             xmlRegisterInputCallbacks
                       (pythonInputMatchCallback,pythonInputOpenCallback,xmlPythonFileReadRaw,
                        xmlPythonFileCloseRaw);
        if (pythonInputCallbackID == -1) {
          pPVar2 = (PyObject *)PyErr_NoMemory();
          return pPVar2;
        }
        pythonInputOpenCallbackObject = local_10;
        local_10->ob_refcnt = local_10->ob_refcnt + 1;
      }
      pPVar2 = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
  }
  return pPVar2;
}

Assistant:

PyObject *
libxml_xmlRegisterInputCallback(ATTRIBUTE_UNUSED PyObject *self,
                                PyObject *args) {
    PyObject *cb;

    if (!PyArg_ParseTuple(args,
		(const char *)"O:libxml_xmlRegisterInputCallback", &cb))
	return(NULL);

    if (!PyCallable_Check(cb)) {
	PyErr_SetString(PyExc_ValueError, "input callback is not callable");
	return(NULL);
    }

    /* Python module registers a single callback and manages the list of
     * all callbacks internally. This is necessitated by xmlInputMatchCallback
     * API, which does not allow for passing of data objects to discriminate
     * different Python methods.  */
    if (pythonInputCallbackID == -1) {
	pythonInputCallbackID = xmlRegisterInputCallbacks(
		pythonInputMatchCallback, pythonInputOpenCallback,
		xmlPythonFileReadRaw, xmlPythonFileCloseRaw);
	if (pythonInputCallbackID == -1)
	    return PyErr_NoMemory();
	pythonInputOpenCallbackObject = cb;
	Py_INCREF(pythonInputOpenCallbackObject);
    }

    Py_INCREF(Py_None);
    return(Py_None);
}